

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O1

PrgDisj * __thiscall
Clasp::Asp::LogicProgram::getDisjFor(LogicProgram *this,AtomSpan *head,uint32 headHash)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  pointer puVar4;
  PrgDisj *pPVar5;
  size_t sVar6;
  uint *puVar7;
  PrgNode PVar8;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> _Var9;
  uint uVar10;
  long lVar11;
  bool bVar12;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>_>
  pVar13;
  PrgDisj *d;
  PrgDisj *local_40;
  uint32 local_34;
  uint32 local_30;
  uint local_2c;
  
  local_40 = (PrgDisj *)0x0;
  local_34 = headHash;
  if (headHash != 0) {
    pVar13 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
             ::equal_range(&(this->index_->disj)._M_h,&local_34);
    _Var9._M_cur = (__node_type *)
                   pVar13.first.
                   super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                   _M_cur;
    pPVar5 = local_40;
    if ((_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)_Var9._M_cur !=
        pVar13.second.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
        _M_cur.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>) {
      uVar2 = (this->atomState_).state_.ebo_.size;
      puVar4 = (this->atomState_).state_.ebo_.buf;
      do {
        pPVar5 = (this->disjunctions_).ebo_.buf
                 [*(uint *)((long)&((_Var9._M_cur)->
                                   super__Hash_node_value<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_unsigned_int,_unsigned_int>_>
                                   ._M_storage._M_storage + 4)];
        if ((((pPVar5->super_PrgHead).super_PrgNode.field_0x7 & 0x40) == 0) &&
           (uVar10 = *(uint *)&(pPVar5->super_PrgHead).field_0x18 & 0x7ffffff,
           head->size == (ulong)uVar10)) {
          bVar12 = uVar10 == 0;
          if (!bVar12) {
            uVar3 = *(uint *)&(pPVar5->super_PrgHead).field_0x1c;
            if ((uVar2 <= uVar3) || ((puVar4[uVar3] & 4) == 0)) goto LAB_0014023f;
            lVar11 = 0;
            do {
              bVar12 = (ulong)(uVar10 << 2) - 4 == lVar11;
              if ((bVar12) ||
                 (uVar3 = *(uint *)(&pPVar5[1].super_PrgHead.super_PrgNode.field_0x0 + lVar11),
                 uVar2 <= uVar3)) break;
              lVar11 = lVar11 + 4;
            } while ((puVar4[uVar3] & 4) != 0);
          }
          if (bVar12) break;
        }
LAB_0014023f:
        _Var9._M_cur = (__node_type *)((_Var9._M_cur)->super__Hash_node_base)._M_nxt;
        pPVar5 = local_40;
      } while ((_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)_Var9._M_cur
               != pVar13.second.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                  _M_cur.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>);
    }
    local_40 = pPVar5;
    sVar6 = head->size;
    if (sVar6 != 0) {
      puVar7 = head->first;
      lVar11 = 0;
      do {
        uVar2 = *(uint *)((long)puVar7 + lVar11);
        if (uVar2 < (this->atomState_).state_.ebo_.size) {
          pbVar1 = (this->atomState_).state_.ebo_.buf + uVar2;
          *pbVar1 = *pbVar1 & 0xe0;
        }
        lVar11 = lVar11 + 4;
      } while (sVar6 << 2 != lVar11);
    }
  }
  if (local_40 == (PrgDisj *)0x0) {
    *(int *)(&this->field_0x64 + (long)this->statsId_ * 4) =
         *(int *)(&this->field_0x64 + (long)this->statsId_ * 4) + 1;
    local_40 = PrgDisj::create((this->disjunctions_).ebo_.size,head);
    bk_lib::pod_vector<Clasp::Asp::PrgDisj_*,_std::allocator<Clasp::Asp::PrgDisj_*>_>::push_back
              (&this->disjunctions_,&local_40);
    sVar6 = head->size;
    if (sVar6 != 0) {
      PVar8 = (local_40->super_PrgHead).super_PrgNode;
      uVar2 = *(uint *)&(local_40->super_PrgHead).field_0x18;
      puVar7 = head->first;
      lVar11 = 0;
      do {
        PrgHead::addSupport(&(this->atoms_).ebo_.buf[*(uint *)((long)puVar7 + lVar11)]->
                             super_PrgHead,
                            (PrgEdge)(((uint)((ulong)PVar8 >> 0x1c) & 0xfffffff0) +
                                      ((int)~uVar2 >> 0x1f) * -8 + 2),force_simplify);
        lVar11 = lVar11 + 4;
      } while (sVar6 << 2 != lVar11);
    }
    if (local_34 != 0) {
      local_2c = *(uint *)&(local_40->super_PrgHead).super_PrgNode.field_0x4 & 0xfffffff;
      local_30 = local_34;
      std::
      _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
      ::_M_emplace<std::pair<unsigned_int_const,unsigned_int>>
                ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                  *)&this->index_->disj,0);
    }
  }
  return local_40;
}

Assistant:

PrgDisj* LogicProgram::getDisjFor(const Potassco::AtomSpan& head, uint32 headHash) {
	PrgDisj* d = 0;
	if (headHash) {
		IndexRange eqRange = index_->disj.equal_range(headHash);
		for (; eqRange.first != eqRange.second; ++eqRange.first) {
			PrgDisj& o = *disjunctions_[eqRange.first->second];
			if (o.relevant() && o.size() == Potassco::size(head) && atomState_.allMarked(o.begin(), o.end(), AtomState::head_flag)) {
				assert(o.id() == eqRange.first->second);
				d = &o;
				break;
			}
		}
		for (Potassco::AtomSpan::iterator it = Potassco::begin(head), end = Potassco::end(head); it != end; ++it) {
			atomState_.clearRule(*it);
		}
	}
	if (!d) {
		// no corresponding disjunction exists, create a new object
		// and link it to all atoms
		++stats.disjunctions[statsId_];
		d = PrgDisj::create((uint32)disjunctions_.size(), head);
		disjunctions_.push_back(d);
		PrgEdge edge = PrgEdge::newEdge(*d, PrgEdge::Choice);
		for (Potassco::AtomSpan::iterator it = Potassco::begin(head), end = Potassco::end(head); it != end; ++it) {
			getAtom(*it)->addSupport(edge);
		}
		if (headHash) {
			index_->disj.insert(IndexMap::value_type(headHash, d->id()));
		}
	}
	return d;
}